

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

void mpack_start_map(mpack_writer_t *writer,uint32_t count)

{
  _Bool _Var1;
  uint8_t *u;
  byte *pbVar2;
  long lVar3;
  char *pcVar4;
  ulong uVar5;
  
  if (count < 0x10) {
    pbVar2 = (byte *)writer->current;
    if ((byte *)writer->end == pbVar2) {
      _Var1 = mpack_writer_ensure(writer,1);
      if (!_Var1) {
        return;
      }
      pbVar2 = (byte *)writer->current;
    }
    *pbVar2 = (byte)count | 0x80;
    lVar3 = 1;
  }
  else {
    pcVar4 = writer->current;
    uVar5 = (long)writer->end - (long)pcVar4;
    if (count < 0x10000) {
      if (uVar5 < 3) {
        _Var1 = mpack_writer_ensure(writer,3);
        if (!_Var1) {
          return;
        }
        pcVar4 = writer->current;
      }
      *pcVar4 = -0x22;
      *(ushort *)(pcVar4 + 1) = (ushort)count << 8 | (ushort)count >> 8;
      lVar3 = 3;
    }
    else {
      if (uVar5 < 5) {
        _Var1 = mpack_writer_ensure(writer,5);
        if (!_Var1) {
          return;
        }
        pcVar4 = writer->current;
      }
      *pcVar4 = -0x21;
      *(uint32_t *)(pcVar4 + 1) =
           count >> 0x18 | (count & 0xff0000) >> 8 | (count & 0xff00) << 8 | count << 0x18;
      lVar3 = 5;
    }
  }
  writer->current = writer->current + lVar3;
  return;
}

Assistant:

void mpack_start_map(mpack_writer_t* writer, uint32_t count) {
    mpack_writer_track_element(writer);

    if (count <= 15) {
        MPACK_WRITE_ENCODED(mpack_encode_fixmap, MPACK_TAG_SIZE_FIXMAP, (uint8_t)count);
    } else if (count <= UINT16_MAX) {
        MPACK_WRITE_ENCODED(mpack_encode_map16, MPACK_TAG_SIZE_MAP16, (uint16_t)count);
    } else {
        MPACK_WRITE_ENCODED(mpack_encode_map32, MPACK_TAG_SIZE_MAP32, (uint32_t)count);
    }

    mpack_writer_track_push(writer, mpack_type_map, count);
}